

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O3

void __thiscall CMU462::DynamicScene::Mesh::check_finite_positions(Mesh *this)

{
  list<CMU462::Vertex,_std::allocator<CMU462::Vertex>_> *plVar1;
  _List_node_base *p_Var2;
  string local_50;
  
  if (this->alreadyCheckingPositions == false) {
    this->alreadyCheckingPositions = true;
    plVar1 = &(this->mesh).vertices;
    p_Var2 = (this->mesh).vertices.super__List_base<CMU462::Vertex,_std::allocator<CMU462::Vertex>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    if (p_Var2 != (_List_node_base *)plVar1) {
      do {
        if (((0x7fefffffffffffff < ((ulong)p_Var2[1]._M_prev & 0x7fffffffffffffff)) ||
            (0x7fefffffffffffff < ((ulong)p_Var2[2]._M_next & 0x7fffffffffffffff))) ||
           (0x7fefffffffffffff < ((ulong)p_Var2[2]._M_prev & 0x7fffffffffffffff))) {
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,"You set a vertex position to a non-finite value.","");
          showError(&local_50,true);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
        }
        p_Var2 = p_Var2->_M_next;
      } while (p_Var2 != (_List_node_base *)plVar1);
    }
    this->alreadyCheckingPositions = false;
  }
  return;
}

Assistant:

void Mesh::check_finite_positions() {

  // If the error triggers below, the showError() routine will internally return
  // to the draw loop to enable the GUI, but that calls mesh.draw() again, which
  // can call this method again, resulting in an infinite loop. To avoid this,
  // ensure we don't recurse.
  if(alreadyCheckingPositions) {
    return;
  }
  alreadyCheckingPositions = true;

  // Check if all vertex positions are finite
  for (VertexIter v = mesh.verticesBegin(); v != mesh.verticesEnd(); v++) {
    Vector3D position = v->position;
    bool finite = std::isfinite(position.x) && std::isfinite(position.y) && std::isfinite(position.z);

    if(!finite) {
      showError("You set a vertex position to a non-finite value.", true);
    }
  }

  alreadyCheckingPositions = false;
}